

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O1

Result __thiscall wabt::ExprVisitor::VisitFunc(ExprVisitor *this,Func *func)

{
  Expr *root_expr;
  Result RVar1;
  
  root_expr = (func->exprs).first_;
  while ((root_expr != (Expr *)0x0 && (RVar1 = VisitExpr(this,root_expr), RVar1.enum_ != Error))) {
    root_expr = (root_expr->super_intrusive_list_base<wabt::Expr>).next_;
  }
  RVar1.enum_._1_3_ = 0;
  RVar1.enum_._0_1_ = root_expr != (Expr *)0x0;
  return (Result)RVar1.enum_;
}

Assistant:

Result ExprVisitor::VisitExprList(ExprList& exprs) {
  for (Expr& expr : exprs)
    CHECK_RESULT(VisitExpr(&expr));
  return Result::Ok;
}